

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void ssl_flight_free(mbedtls_ssl_flight_item *flight)

{
  mbedtls_ssl_flight_item *pmVar1;
  mbedtls_ssl_flight_item *cur;
  
  if (flight != (mbedtls_ssl_flight_item *)0x0) {
    do {
      pmVar1 = flight->next;
      free(flight->p);
      free(flight);
      flight = pmVar1;
    } while (pmVar1 != (mbedtls_ssl_flight_item *)0x0);
  }
  return;
}

Assistant:

static void ssl_flight_free( mbedtls_ssl_flight_item *flight )
{
    mbedtls_ssl_flight_item *cur = flight;
    mbedtls_ssl_flight_item *next;

    while( cur != NULL )
    {
        next = cur->next;

        mbedtls_free( cur->p );
        mbedtls_free( cur );

        cur = next;
    }
}